

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  _Base_ptr *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  undefined8 *puVar4;
  GoogleOnceDynamic *pGVar5;
  Descriptor *pDVar6;
  _Base_ptr p_Var7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  _Base_ptr p_Var11;
  long lVar12;
  long lVar13;
  long lVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  Descriptor *this_00;
  long lVar17;
  int *piVar18;
  long lVar19;
  undefined1 local_3c8 [48];
  vector<int,_std::allocator<int>_> path;
  SubstituteArg local_360;
  SubstituteArg local_330;
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  _Alloc_hider local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  vector<int,_std::allocator<int>_> path_1;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  SourceLocationCommentPrinter comment_printer;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  SubstituteArg local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
            ((vector<int,std::allocator<int>> *)&path,(iterator)0x0,
             &FileDescriptorProto::kSyntaxFieldNumber);
  pp_Var1 = &groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  groups._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&groups,"");
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            (&comment_printer,this,&path,(string *)&groups,debug_string_options);
  if ((_Base_ptr *)groups._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)groups._M_t._M_impl._0_8_,
                    (ulong)((long)&(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  groups._M_t._M_impl._0_8_ = SyntaxName(*(Syntax *)(this + 0x8c));
  sVar10 = strlen((char *)groups._M_t._M_impl._0_8_);
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)sVar10;
  public_dependencies._M_t._M_impl._0_8_ = 0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  weak_dependencies._M_t._M_impl._0_8_ = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  local_3c8._0_8_ = (char *)0x0;
  local_3c8._8_4_ = -1;
  local_1a8.text_ = (char *)0x0;
  local_1a8.size_ = -1;
  local_1d8.text_ = (char *)0x0;
  local_1d8.size_ = -1;
  local_208.text_ = (char *)0x0;
  local_208.size_ = -1;
  local_300.text_ = (char *)0x0;
  local_300.size_ = -1;
  local_330.text_ = (char *)0x0;
  local_330.size_ = -1;
  local_360.text_ = (char *)0x0;
  local_360.size_ = -1;
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"syntax = \"$0\";\n\n",(SubstituteArg *)&groups,
             (SubstituteArg *)&public_dependencies,(SubstituteArg *)&weak_dependencies,
             (SubstituteArg *)local_3c8,&local_1a8,&local_1d8,&local_208,&local_300,&local_330,
             &local_360);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  pp_Var1 = &groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p,
                    comment_printer.prefix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.trailing_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0])
                    + 1);
  }
  paVar2 = &comment_printer.source_loc_.leading_comments.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p != paVar2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.leading_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0]) +
                    1);
  }
  if (path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  groups._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&groups,"");
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&comment_printer.prefix_,groups._M_t._M_impl._0_8_,
             CONCAT44(groups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color) +
             groups._M_t._M_impl._0_8_);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  if ((_Base_ptr *)groups._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)groups._M_t._M_impl._0_8_,
                    (ulong)((long)&(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  p_Var3 = &public_dependencies._M_t._M_impl.super__Rb_tree_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar18 = *(int **)(this + 0x40);
  groups._M_t._M_impl._0_8_ = &public_dependencies;
  if ((long)*(int *)(this + 0x38) != 0) {
    lVar13 = (long)*(int *)(this + 0x38) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &public_dependencies,(const_iterator)p_Var3,piVar18,(_Alloc_node *)&groups);
      piVar18 = piVar18 + 1;
      lVar13 = lVar13 + -4;
    } while (lVar13 != 0);
  }
  piVar18 = *(int **)(this + 0x50);
  groups._M_t._M_impl._0_8_ = &weak_dependencies;
  if ((long)*(int *)(this + 0x48) != 0) {
    lVar13 = (long)*(int *)(this + 0x48) << 2;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique_<int&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &weak_dependencies,
                 (const_iterator)&weak_dependencies._M_t._M_impl.super__Rb_tree_header,piVar18,
                 (_Alloc_node *)&groups);
      piVar18 = piVar18 + 1;
      lVar13 = lVar13 + -4;
    } while (lVar13 != 0);
  }
  if (0 < *(int *)(this + 0x18)) {
    lVar13 = 0;
    do {
      p_Var7 = public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var16 = &p_Var3->_M_header;
      if (public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
          (_Base_ptr)0x0) {
LAB_0056b01b:
        if (weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
            (_Base_ptr)0x0) {
          p_Var7 = weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var16 = &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
          do {
            p_Var15 = p_Var16;
            p_Var11 = p_Var7;
            lVar12 = (long)(int)p_Var11[1]._M_color;
            p_Var16 = p_Var11;
            if (lVar12 < lVar13) {
              p_Var16 = p_Var15;
            }
            p_Var7 = (&p_Var11->_M_left)[lVar12 < lVar13];
          } while ((&p_Var11->_M_left)[lVar12 < lVar13] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var16 != &weak_dependencies._M_t._M_impl.super__Rb_tree_header) {
            if (lVar12 < lVar13) {
              p_Var11 = p_Var15;
            }
            if ((int)p_Var11[1]._M_color <= lVar13) {
              if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
                GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                          (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
              }
              puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar13 * 8);
              groups._M_t._M_impl._0_8_ = *puVar4;
              groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   *(_Rb_tree_color *)(puVar4 + 1);
              local_3c8._0_8_ = (char *)0x0;
              local_3c8._8_4_ = -1;
              local_1a8.text_ = (char *)0x0;
              local_1a8.size_ = -1;
              local_1d8.text_ = (char *)0x0;
              local_1d8.size_ = -1;
              local_208.text_ = (char *)0x0;
              local_208.size_ = -1;
              local_300.text_ = (char *)0x0;
              local_300.size_ = -1;
              local_330.text_ = (char *)0x0;
              local_330.size_ = -1;
              local_360.text_ = (char *)0x0;
              local_360.size_ = -1;
              path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)0x0;
              path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                            0xffffffff);
              local_2d0.text_ = (char *)0x0;
              local_2d0.size_ = -1;
              strings::SubstituteAndAppend
                        (__return_storage_ptr__,"import weak \"$0\";\n",(SubstituteArg *)&groups,
                         (SubstituteArg *)local_3c8,&local_1a8,&local_1d8,&local_208,&local_300,
                         &local_330,&local_360,(SubstituteArg *)&path,&local_2d0);
              goto LAB_0056b3cd;
            }
          }
        }
        if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                    (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
        }
        puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar13 * 8);
        groups._M_t._M_impl._0_8_ = *puVar4;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar4 + 1);
        local_3c8._0_8_ = (char *)0x0;
        local_3c8._8_4_ = -1;
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_1d8.text_ = (char *)0x0;
        local_1d8.size_ = -1;
        local_208.text_ = (char *)0x0;
        local_208.size_ = -1;
        local_300.text_ = (char *)0x0;
        local_300.size_ = -1;
        local_330.text_ = (char *)0x0;
        local_330.size_ = -1;
        local_360.text_ = (char *)0x0;
        local_360.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",(SubstituteArg *)&groups,
                   (SubstituteArg *)local_3c8,&local_1a8,&local_1d8,&local_208,&local_300,&local_330
                   ,&local_360,(SubstituteArg *)&path,&local_2d0);
      }
      else {
        do {
          p_Var15 = p_Var16;
          p_Var11 = p_Var7;
          lVar12 = (long)(int)p_Var11[1]._M_color;
          p_Var16 = p_Var11;
          if (lVar12 < lVar13) {
            p_Var16 = p_Var15;
          }
          p_Var7 = (&p_Var11->_M_left)[lVar12 < lVar13];
        } while ((&p_Var11->_M_left)[lVar12 < lVar13] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var16 == p_Var3) goto LAB_0056b01b;
        if (lVar12 < lVar13) {
          p_Var11 = p_Var15;
        }
        if (lVar13 < (int)p_Var11[1]._M_color) goto LAB_0056b01b;
        if (*(GoogleOnceDynamic **)(this + 0x30) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FileDescriptor_const>
                    (*(GoogleOnceDynamic **)(this + 0x30),DependenciesOnceInit,this);
        }
        puVar4 = (undefined8 *)**(long **)(*(long *)(this + 0x20) + lVar13 * 8);
        groups._M_t._M_impl._0_8_ = *puVar4;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(puVar4 + 1);
        local_3c8._0_8_ = (char *)0x0;
        local_3c8._8_4_ = -1;
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_1d8.text_ = (char *)0x0;
        local_1d8.size_ = -1;
        local_208.text_ = (char *)0x0;
        local_208.size_ = -1;
        local_300.text_ = (char *)0x0;
        local_300.size_ = -1;
        local_330.text_ = (char *)0x0;
        local_330.size_ = -1;
        local_360.text_ = (char *)0x0;
        local_360.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import public \"$0\";\n",(SubstituteArg *)&groups,
                   (SubstituteArg *)local_3c8,&local_1a8,&local_1d8,&local_208,&local_300,&local_330
                   ,&local_360,(SubstituteArg *)&path,&local_2d0);
      }
LAB_0056b3cd:
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)(this + 0x18));
  }
  if (*(long *)(*(long *)(this + 8) + 8) != 0) {
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&path_1,(iterator)0x0,
               &FileDescriptorProto::kPackageFieldNumber);
    local_3c8._0_8_ = local_3c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"");
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&groups,this,&path_1,(string *)local_3c8,
               debug_string_options);
    if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
      operator_delete((void *)local_3c8._0_8_,local_3c8._16_8_ + 1);
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    local_3c8._0_8_ = **(undefined8 **)(this + 8);
    local_3c8._8_4_ = *(undefined4 *)(*(undefined8 **)(this + 8) + 1);
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    local_1d8.text_ = (char *)0x0;
    local_1d8.size_ = -1;
    local_208.text_ = (char *)0x0;
    local_208.size_ = -1;
    local_300.text_ = (char *)0x0;
    local_300.size_ = -1;
    local_330.text_ = (char *)0x0;
    local_330.size_ = -1;
    local_360.text_ = (char *)0x0;
    local_360.size_ = -1;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,0xffffffff);
    local_2d0.text_ = (char *)0x0;
    local_2d0.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",(SubstituteArg *)local_3c8,&local_1a8,
               &local_1d8,&local_208,&local_300,&local_330,&local_360,(SubstituteArg *)&path,
               &local_2d0,&local_60);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p != &local_218) {
      operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_p != &local_258) {
      operator_delete(local_268._M_p,local_258._M_allocated_capacity + 1);
    }
    if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        (_Base_ptr)&groups._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      operator_delete(groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                      groups._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
    }
    if (path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  bVar8 = anon_unknown_1::FormatLineOptions
                    (0,*(Message **)(this + 0xa0),*(DescriptorPool **)(this + 0x10),
                     __return_storage_ptr__);
  if (bVar8) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      EnumDescriptor::DebugString
                ((EnumDescriptor *)(*(long *)(this + 0x70) + lVar13),0,__return_storage_ptr__,
                 debug_string_options);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < *(int *)(this + 0x68));
  }
  p_Var3 = &groups._M_t._M_impl.super__Rb_tree_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  if (0 < *(int *)(this + 0x88)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      lVar19 = *(long *)(this + 0x98);
      pGVar5 = *(GoogleOnceDynamic **)(lVar19 + 0x40 + lVar13);
      if (pGVar5 != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (pGVar5,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar19 + lVar13));
      }
      if (*(int *)(lVar19 + 0x48 + lVar13) == 10) {
        lVar19 = *(long *)(this + 0x98);
        pGVar5 = *(GoogleOnceDynamic **)(lVar19 + 0x40 + lVar13);
        if (pGVar5 != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (pGVar5,FieldDescriptor::TypeOnceInit,(FieldDescriptor *)(lVar19 + lVar13));
        }
        local_3c8._0_8_ = *(undefined8 *)(lVar19 + 0x70 + lVar13);
        std::
        _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_insert_unique<google::protobuf::Descriptor_const*>
                  ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&groups,(Descriptor **)local_3c8);
      }
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0xa8;
    } while (lVar12 < *(int *)(this + 0x88));
  }
  iVar9 = *(int *)(this + 0x58);
  if (0 < iVar9) {
    lVar13 = 0;
    do {
      this_00 = (Descriptor *)(lVar13 * 0xa8 + *(long *)(this + 0x60));
      p_Var7 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var16 = &p_Var3->_M_header;
      if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0056b794:
        Descriptor::DebugString(this_00,0,__return_storage_ptr__,debug_string_options,true);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        iVar9 = *(int *)(this + 0x58);
      }
      else {
        do {
          p_Var15 = p_Var16;
          p_Var11 = p_Var7;
          pDVar6 = *(Descriptor **)(p_Var11 + 1);
          p_Var16 = p_Var11;
          if (pDVar6 < this_00) {
            p_Var16 = p_Var15;
          }
          p_Var7 = (&p_Var11->_M_left)[pDVar6 < this_00];
        } while ((&p_Var11->_M_left)[pDVar6 < this_00] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var16 == p_Var3) goto LAB_0056b794;
        if (pDVar6 < this_00) {
          p_Var11 = p_Var15;
        }
        if (this_00 < *(Descriptor **)(p_Var11 + 1)) goto LAB_0056b794;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar9);
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      ServiceDescriptor::DebugString
                ((ServiceDescriptor *)(*(long *)(this + 0x80) + lVar13),__return_storage_ptr__,
                 debug_string_options);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x30;
    } while (lVar12 < *(int *)(this + 0x78));
  }
  if (0 < *(int *)(this + 0x88)) {
    lVar12 = 0;
    lVar19 = 0;
    lVar13 = 0;
    do {
      lVar17 = *(long *)(this + 0x98);
      lVar14 = *(long *)(lVar17 + 0x58 + lVar12);
      if (lVar14 != lVar13) {
        if (lVar12 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          lVar14 = *(long *)(*(long *)(this + 0x98) + 0x58 + lVar12);
        }
        local_3c8._0_8_ = **(undefined8 **)(lVar14 + 8);
        local_3c8._8_4_ = *(undefined4 *)(*(undefined8 **)(lVar14 + 8) + 1);
        local_1a8.text_ = (char *)0x0;
        local_1a8.size_ = -1;
        local_1d8.text_ = (char *)0x0;
        local_1d8.size_ = -1;
        local_208.text_ = (char *)0x0;
        local_208.size_ = -1;
        local_300.text_ = (char *)0x0;
        local_300.size_ = -1;
        local_330.text_ = (char *)0x0;
        local_330.size_ = -1;
        local_360.text_ = (char *)0x0;
        local_360.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"extend .$0 {\n",(SubstituteArg *)local_3c8,&local_1a8,
                   &local_1d8,&local_208,&local_300,&local_330,&local_360,(SubstituteArg *)&path,
                   &local_2d0,&local_60);
        lVar17 = *(long *)(this + 0x98);
        lVar13 = lVar14;
      }
      FieldDescriptor::DebugString
                ((FieldDescriptor *)(lVar17 + lVar12),1,PRINT_LABEL,__return_storage_ptr__,
                 debug_string_options);
      lVar19 = lVar19 + 1;
      lVar12 = lVar12 + 0xa8;
    } while (lVar19 < *(int *)(this + 0x88));
    if (0 < *(int *)(this + 0x88)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&weak_dependencies._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&public_dependencies._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
    operator_delete(comment_printer.prefix_._M_dataplus._M_p,
                    comment_printer.prefix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&comment_printer.source_loc_.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.trailing_comments.field_2) {
    operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.trailing_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
      &comment_printer.source_loc_.leading_comments.field_2) {
    operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p,
                    CONCAT71(comment_printer.source_loc_.leading_comments.field_2.
                             _M_allocated_capacity._1_7_,
                             comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0]) +
                    1);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(
        this, path, "", debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                 SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter
      comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(
        this, path, "", debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = NULL;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, FieldDescriptor::PRINT_LABEL, &contents,
                              debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}